

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAlloc(Abc_NtkType_t Type,Abc_NtkFunc_t Func,int fUseMemMan)

{
  uint uVar1;
  Abc_Ntk_t *pNtkAig;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Mem_Fixed_t *pMVar4;
  Mem_Step_t *pMVar5;
  DdManager *pDVar6;
  Nm_Man_t *pNVar7;
  int iVar8;
  
  pNtkAig = (Abc_Ntk_t *)malloc(0x1c8);
  memset(pNtkAig,0,0x1c8);
  pNtkAig->ntkType = Type;
  pNtkAig->ntkFunc = Func;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vObjs = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vPios = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vPis = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vPos = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vCis = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vCos = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vBoxes = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pNtkAig->vLtlProperties = pVVar2;
  if (fUseMemMan == 0) {
    pNtkAig->pMmObj = (Mem_Fixed_t *)0x0;
    pMVar5 = (Mem_Step_t *)0x0;
  }
  else {
    pMVar4 = Mem_FixedStart(0x48);
    pNtkAig->pMmObj = pMVar4;
    pMVar5 = Mem_StepStart(10);
  }
  pNtkAig->pMmStep = pMVar5;
  pNtkAig->nTravIds = 1;
  if (pNtkAig->ntkType != ABC_NTK_STRASH) {
    pVVar2 = pNtkAig->vObjs;
    uVar1 = pVVar2->nCap;
    if (pVVar2->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar3;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar1 * 2;
        if (iVar8 <= (int)uVar1) goto LAB_001ea96f;
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
        }
        pVVar2->pArray = ppvVar3;
      }
      pVVar2->nCap = iVar8;
    }
LAB_001ea96f:
    iVar8 = pVVar2->nSize;
    pVVar2->nSize = iVar8 + 1;
    pVVar2->pArray[iVar8] = (void *)0x0;
  }
  if (pNtkAig->ntkType == ABC_NTK_STRASH) {
    pDVar6 = (DdManager *)Abc_AigAlloc(pNtkAig);
  }
  else {
    switch(pNtkAig->ntkFunc) {
    case ABC_FUNC_SOP:
    case ABC_FUNC_BLIFMV:
      pDVar6 = (DdManager *)Mem_FlexStart();
      break;
    case ABC_FUNC_BDD:
      pDVar6 = Cudd_Init(0x14,0,0x100,0x40000,0);
      break;
    case ABC_FUNC_AIG:
      pDVar6 = (DdManager *)Hop_ManStart();
      break;
    case ABC_FUNC_MAP:
      pDVar6 = (DdManager *)Abc_FrameReadLibGen();
      break;
    case ABC_FUNC_BLACKBOX:
      goto switchD_001ea9b1_caseD_6;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x5a,"Abc_Ntk_t *Abc_NtkAlloc(Abc_NtkType_t, Abc_NtkFunc_t, int)");
    }
  }
  pNtkAig->pManFunc = pDVar6;
switchD_001ea9b1_caseD_6:
  pNVar7 = Nm_ManCreate(200);
  pNtkAig->pManName = pNVar7;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0xf;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x78);
  pVVar2->pArray = ppvVar3;
  pVVar2->nSize = 0xf;
  ppvVar3[0xc] = (void *)0x0;
  ppvVar3[0xd] = (void *)0x0;
  ppvVar3[10] = (void *)0x0;
  ppvVar3[0xb] = (void *)0x0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[9] = (void *)0x0;
  ppvVar3[6] = (void *)0x0;
  ppvVar3[7] = (void *)0x0;
  ppvVar3[4] = (void *)0x0;
  ppvVar3[5] = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  ppvVar3[3] = (void *)0x0;
  *ppvVar3 = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  ppvVar3[0xe] = (void *)0x0;
  pNtkAig->vAttrs = pVVar2;
  pNtkAig->AndGateDelay = 0.0;
  return pNtkAig;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a new Ntk.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkAlloc( Abc_NtkType_t Type, Abc_NtkFunc_t Func, int fUseMemMan )
{
    Abc_Ntk_t * pNtk;
    pNtk = ABC_ALLOC( Abc_Ntk_t, 1 );
    memset( pNtk, 0, sizeof(Abc_Ntk_t) );
    pNtk->ntkType     = Type;
    pNtk->ntkFunc     = Func;
    // start the object storage
    pNtk->vObjs       = Vec_PtrAlloc( 100 );
    pNtk->vPios       = Vec_PtrAlloc( 100 );
    pNtk->vPis        = Vec_PtrAlloc( 100 );
    pNtk->vPos        = Vec_PtrAlloc( 100 );
    pNtk->vCis        = Vec_PtrAlloc( 100 );
    pNtk->vCos        = Vec_PtrAlloc( 100 );
    pNtk->vBoxes      = Vec_PtrAlloc( 100 );
	pNtk->vLtlProperties = Vec_PtrAlloc( 100 );
    // start the memory managers
    pNtk->pMmObj      = fUseMemMan? Mem_FixedStart( sizeof(Abc_Obj_t) ) : NULL;
    pNtk->pMmStep     = fUseMemMan? Mem_StepStart( ABC_NUM_STEPS ) : NULL;
    // get ready to assign the first Obj ID
    pNtk->nTravIds    = 1;
    // start the functionality manager
    if ( !Abc_NtkIsStrash(pNtk) )
        Vec_PtrPush( pNtk->vObjs, NULL );
    if ( Abc_NtkIsStrash(pNtk) )
        pNtk->pManFunc = Abc_AigAlloc( pNtk );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNtk->pManFunc = Mem_FlexStart();
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNtk->pManFunc = Cudd_Init( 20, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNtk->pManFunc = Hop_ManStart();
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = Abc_FrameReadLibGen();
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // name manager
    pNtk->pManName = Nm_ManCreate( 200 );
    // attribute manager
    pNtk->vAttrs = Vec_PtrStart( VEC_ATTR_TOTAL_NUM );
    // estimated AndGateDelay
    pNtk->AndGateDelay = 0.0;
    return pNtk;
}